

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption(UninterpretedOption *this,Arena *arena)

{
  Arena *in_RSI;
  UninterpretedOption *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  UninterpretedOption *in_stack_ffffffffffffffd0;
  
  Message::Message(&in_RDI->super_Message);
  ((RepeatedPtrFieldBase *)&in_RDI->super_Message)->arena_ =
       (Arena *)&PTR__UninterpretedOption_008db330;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_RDI,in_stack_ffffffffffffffb8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x513d58);
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)in_RDI,
             (Arena *)&in_RDI->name_);
  SharedCtor(in_stack_ffffffffffffffd0);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  name_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.UninterpretedOption)
}